

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O3

RuleBasedTimeZone * __thiscall
icu_63::RuleBasedTimeZone::operator=(RuleBasedTimeZone *this,RuleBasedTimeZone *right)

{
  int iVar1;
  undefined4 extraout_var;
  UVector *pUVar2;
  RuleBasedTimeZone *this_00;
  
  iVar1 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x15])();
  if ((char)iVar1 != '\0') {
    TimeZone::operator=((TimeZone *)this,(TimeZone *)right);
    deleteRules(this);
    this_00 = (RuleBasedTimeZone *)right->fInitialRule;
    iVar1 = (*(((TimeZoneRule *)&this_00->super_BasicTimeZone)->super_UObject)._vptr_UObject[3])();
    this->fInitialRule = (InitialTimeZoneRule *)CONCAT44(extraout_var,iVar1);
    pUVar2 = copyRules(this_00,right->fHistoricRules);
    this->fHistoricRules = pUVar2;
    pUVar2 = copyRules(this_00,right->fFinalRules);
    this->fFinalRules = pUVar2;
    deleteTransitions(this);
    this->fUpToDate = '\0';
  }
  return this;
}

Assistant:

RuleBasedTimeZone&
RuleBasedTimeZone::operator=(const RuleBasedTimeZone& right) {
    if (*this != right) {
        BasicTimeZone::operator=(right);
        deleteRules();
        fInitialRule = right.fInitialRule->clone();
        fHistoricRules = copyRules(right.fHistoricRules);
        fFinalRules = copyRules(right.fFinalRules);
        deleteTransitions();
        fUpToDate = FALSE;
    }
    return *this;
}